

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

PNode * find_PNode(Parser *p,char *start,char *end_skip,int symbol,D_Scope *sc,uint *hash)

{
  uint32 *puVar1;
  PNode *pPVar2;
  PNode *pPVar3;
  PNode *pPVar4;
  uint uVar5;
  PNode *pn;
  PNode *_t;
  PNode **ppPVar6;
  bool bVar7;
  bool bVar8;
  
  uVar5 = (int)end_skip * 0x10000 + (int)start * 0x100 + (int)sc + symbol;
  *hash = uVar5;
  ppPVar6 = (p->pnode_hash).v;
  if (ppPVar6 == (PNode **)0x0) {
    pPVar4 = (PNode *)0x0;
  }
  else {
    pPVar4 = (PNode *)0x0;
    ppPVar6 = ppPVar6 + (ulong)uVar5 % (ulong)(p->pnode_hash).m;
    while (pPVar2 = *ppPVar6, pPVar2 != (PNode *)0x0) {
      if ((((pPVar2->hash == uVar5) && ((pPVar2->parse_node).symbol == symbol)) &&
          ((pPVar2->parse_node).start_loc.s == start)) &&
         (((pPVar2->parse_node).end_skip == end_skip && (pPVar2->initial_scope == sc)))) {
        pn = pPVar2->latest;
        while (pPVar3 = pn->latest, pn != pPVar3) {
          pPVar3->refcount = pPVar3->refcount + 1;
          puVar1 = &pn->refcount;
          *puVar1 = *puVar1 - 1;
          if (*puVar1 == 0) {
            free_PNode(p,pn);
          }
          pPVar2->latest = pPVar3;
          pn = pPVar3;
        }
        bVar7 = pPVar4 != (PNode *)0x0;
        bVar8 = pPVar4 != pn;
        pPVar4 = pn;
        if (bVar8 && bVar7) {
          __assert_fail("!result || result == t",
                        "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/parse.c"
                        ,0x135,"PNode *find_PNode(Parser *, char *, char *, int, D_Scope *, uint *)"
                       );
        }
      }
      ppPVar6 = &pPVar2->bucket_next;
    }
  }
  return pPVar4;
}

Assistant:

PNode *find_PNode(Parser *p, char *start, char *end_skip, int symbol, D_Scope *sc, uint *hash) {
  PNodeHash *ph = &p->pnode_hash;
  PNode *pn;
  uint h = PNODE_HASH(start, end_skip, symbol, sc);
  *hash = h;
  PNode *result = NULL;
  if (ph->v)
    for (pn = ph->v[h % ph->m]; pn; pn = pn->bucket_next)
      if (pn->hash == h && pn->parse_node.symbol == symbol && pn->parse_node.start_loc.s == start &&
          pn->parse_node.end_skip == end_skip && pn->initial_scope == sc) {
        PNode *t = pn;
        LATEST(p, t);
        assert(!result  || result == t);
        result = t;
      }
  return result;
}